

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char8_t * fmt::v5::internal::
          format_decimal<unsigned_int,fmt::v5::char8_t,fmt::v5::internal::add_thousands_sep<fmt::v5::char8_t>>
                    (char8_t *buffer,uint value,int num_digits,
                    add_thousands_sep<fmt::v5::char8_t> thousands_sep)

{
  long lVar1;
  int in_EDX;
  uint uVar2;
  uint in_ESI;
  long in_RDI;
  uint index;
  uint index_1;
  char8_t *end;
  add_thousands_sep<fmt::v5::char8_t> *this;
  add_thousands_sep<fmt::v5::char8_t> *paVar3;
  
  lVar1 = (long)in_EDX;
  this = (add_thousands_sep<fmt::v5::char8_t> *)(in_RDI + lVar1);
  while (99 < in_ESI) {
    uVar2 = (in_ESI % 100) * 2;
    in_ESI = in_ESI / 100;
    paVar3 = (add_thousands_sep<fmt::v5::char8_t> *)((long)(this + 0xffffffffffffffff) + 0x17);
    *(undefined1 *)((long)(this + 0xffffffffffffffff) + 0x17) = basic_data<void>::DIGITS[uVar2 + 1];
    add_thousands_sep<fmt::v5::char8_t>::operator()(paVar3,(char8_t **)CONCAT44(in_ESI,in_EDX));
    this = (add_thousands_sep<fmt::v5::char8_t> *)((long)(paVar3 + 0xffffffffffffffff) + 0x17);
    *(undefined1 *)((long)(paVar3 + 0xffffffffffffffff) + 0x17) = basic_data<void>::DIGITS[uVar2];
    add_thousands_sep<fmt::v5::char8_t>::operator()(this,(char8_t **)CONCAT44(in_ESI,in_EDX));
  }
  if (in_ESI < 10) {
    *(char8_t *)((long)(this + 0xffffffffffffffff) + 0x17) = (char)in_ESI + 0x30;
  }
  else {
    paVar3 = (add_thousands_sep<fmt::v5::char8_t> *)((long)(this + 0xffffffffffffffff) + 0x17);
    *(undefined1 *)((long)(this + 0xffffffffffffffff) + 0x17) =
         basic_data<void>::DIGITS[in_ESI * 2 + 1];
    add_thousands_sep<fmt::v5::char8_t>::operator()(paVar3,(char8_t **)CONCAT44(in_ESI,in_EDX));
    *(undefined1 *)((long)(paVar3 + 0xffffffffffffffff) + 0x17) =
         basic_data<void>::DIGITS[in_ESI * 2];
  }
  return (char8_t *)(add_thousands_sep<fmt::v5::char8_t> *)(in_RDI + lVar1);
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}